

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sOcclusionQueryTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles3::Stress::OcclusionQueryStressCase::iterate(OcclusionQueryStressCase *this)

{
  int *value;
  int *value_00;
  int *value_01;
  Random *rnd;
  ostringstream *poVar1;
  int iVar2;
  TestLog *log;
  qpWatchDog *pqVar3;
  int count;
  int count_00;
  GLint location;
  deUint32 dVar4;
  GLenum err;
  MessageBuilder *pMVar5;
  TestError *pTVar6;
  int iVar7;
  uint uVar8;
  int i;
  long lVar9;
  ulong uVar10;
  int drawIter;
  float fVar11;
  int local_2ec;
  vector<float,_std::allocator<float>_> vertices;
  vector<unsigned_int,_std::allocator<unsigned_int>_> queryIds;
  vector<float,_std::allocator<float>_> targetVertices;
  vector<float,_std::allocator<float>_> occluderVertices;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  string sectionName;
  ScopedLogSection section;
  vector<unsigned_int,_std::allocator<unsigned_int>_> queryResultReady;
  vector<unsigned_int,_std::allocator<unsigned_int>_> queryResult;
  string local_1d0;
  undefined1 local_1b0 [384];
  
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  location = glwGetUniformLocation((this->m_program->m_program).m_program,"u_color");
  vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  occluderVertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  occluderVertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  occluderVertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  targetVertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  targetVertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  targetVertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1b0._0_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&queryIds,(long)this->m_numQueries,(value_type_conflict4 *)local_1b0,
             (allocator_type *)&sectionName);
  value_00 = &this->m_numQueries;
  local_1b0._0_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&queryResultReady,(long)*value_00,(value_type_conflict4 *)local_1b0,
             (allocator_type *)&sectionName);
  local_1b0._0_8_ = (ulong)(uint)local_1b0._4_4_ << 0x20;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&queryResult,(long)*value_00,(value_type_conflict4 *)local_1b0,
             (allocator_type *)&sectionName);
  local_2ec = this->m_iterNdx + 1;
  de::toString<int>((string *)&section,&local_2ec);
  std::operator+(&local_260,"Case iteration ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,
                 &local_260,"/");
  de::toString<int>(&local_1d0,&NUM_CASE_ITERATIONS);
  std::operator+(&sectionName,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,
                 &local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)local_1b0);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&section);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b0,sectionName._M_dataplus._M_p,(allocator<char> *)&local_1d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_260,sectionName._M_dataplus._M_p,(allocator<char> *)&local_2ec);
  tcu::ScopedLogSection::ScopedLogSection(&section,log,(string *)local_1b0,&local_260);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)local_1b0);
  poVar1 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Parameters:\n");
  std::operator<<((ostream *)poVar1,"- Number of occlusion queries: ");
  pMVar5 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,value_00);
  std::operator<<(&(pMVar5->m_str).super_basic_ostream<char,_std::char_traits<char>_>,".\n");
  std::operator<<(&(pMVar5->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                  "- Number of occluder draws per query: ");
  value = &this->m_numOccluderDraws;
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,value);
  std::operator<<(&(pMVar5->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                  ", primitives per draw: ");
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&this->m_numOccludersPerDraw);
  std::operator<<(&(pMVar5->m_str).super_basic_ostream<char,_std::char_traits<char>_>,".\n");
  std::operator<<(&(pMVar5->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                  "- Number of target draws per query: ");
  value_01 = &this->m_numTargetDraws;
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,value_01);
  std::operator<<(&(pMVar5->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                  ", primitives per draw: ");
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&this->m_numTargetsPerDraw);
  std::operator<<(&(pMVar5->m_str).super_basic_ostream<char,_std::char_traits<char>_>,".\n");
  tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  iVar7 = this->m_numOccludersPerDraw;
  iVar2 = this->m_numTargetsPerDraw;
  std::vector<float,_std::allocator<float>_>::resize(&vertices,400);
  count = iVar7 * 3;
  count_00 = iVar2 * 3;
  rnd = &this->m_rnd;
  for (lVar9 = 0; lVar9 != 0x640; lVar9 = lVar9 + 0x10) {
    fVar11 = deRandom_getFloat(&rnd->m_rnd);
    *(float *)((long)vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start + lVar9) = fVar11 + fVar11 + -1.0;
    fVar11 = deRandom_getFloat(&rnd->m_rnd);
    *(float *)((long)vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start + lVar9 + 4) = fVar11 + fVar11 + -1.0;
    fVar11 = deRandom_getFloat(&rnd->m_rnd);
    *(float *)((long)vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start + lVar9 + 8) = fVar11 + 0.0;
    *(undefined4 *)
     ((long)vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start + lVar9 + 0xc) = 0x3f800000;
  }
  std::vector<float,_std::allocator<float>_>::resize(&occluderVertices,(long)(iVar7 * *value * 0xc))
  ;
  iVar7 = 3;
  for (lVar9 = 0; lVar9 < *value * count; lVar9 = lVar9 + 1) {
    dVar4 = deRandom_getUint32(&rnd->m_rnd);
    uVar10 = (ulong)(dVar4 % 100 << 4);
    occluderVertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_start[iVar7 + -3] =
         *(float *)((long)vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start + uVar10);
    occluderVertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_start[iVar7 + -2] =
         *(float *)((long)vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start + uVar10 + 4);
    occluderVertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_start[iVar7 + -1] =
         *(float *)((long)vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start + uVar10 + 8);
    occluderVertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_start[iVar7] =
         *(float *)((long)vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start + uVar10 + 0xc);
    iVar7 = iVar7 + 4;
  }
  std::vector<float,_std::allocator<float>_>::resize
            (&targetVertices,(long)(iVar2 * *value_01 * 0xc));
  iVar7 = 3;
  for (lVar9 = 0; lVar9 < *value_01 * count_00; lVar9 = lVar9 + 1) {
    dVar4 = deRandom_getUint32(&rnd->m_rnd);
    uVar10 = (ulong)(dVar4 % 100 << 4);
    targetVertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
    ._M_start[iVar7 + -3] =
         *(float *)((long)vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start + uVar10);
    targetVertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
    ._M_start[iVar7 + -2] =
         *(float *)((long)vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start + uVar10 + 4);
    targetVertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
    ._M_start[iVar7 + -1] =
         *(float *)((long)vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start + uVar10 + 8);
    targetVertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
    ._M_start[iVar7] =
         *(float *)((long)vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start + uVar10 + 0xc);
    iVar7 = iVar7 + 4;
  }
  if (this->m_program != (ShaderProgram *)0x0) {
    glwClearColor(0.0,0.0,0.0,1.0);
    glwClearDepthf(1.0);
    glwClear(0x4100);
    glwEnable(0xb71);
    glwUseProgram((this->m_program->m_program).m_program);
    glwEnableVertexAttribArray(0);
    deGetMicroseconds();
    for (uVar10 = 0; (long)uVar10 < (long)*value_00; uVar10 = uVar10 + 1) {
      glwUniform4f(location,0.0,0.0,1.0,1.0);
      iVar7 = 0;
      for (lVar9 = 0; lVar9 < *value; lVar9 = lVar9 + 1) {
        glwVertexAttribPointer
                  (0,4,0x1406,'\0',0,
                   occluderVertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start + iVar7);
        glwDrawArrays(4,0,count);
        iVar7 = iVar7 + count;
      }
      glwGenQueries(1,queryIds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start + uVar10);
      glwBeginQuery(this->m_queryMode,
                    queryIds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start[uVar10]);
      glwUniform4f(location,1.0,0.0,0.0,1.0);
      iVar7 = 0;
      for (lVar9 = 0; lVar9 < *value_01; lVar9 = lVar9 + 1) {
        glwVertexAttribPointer
                  (0,4,0x1406,'\0',0,
                   targetVertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start + iVar7);
        glwDrawArrays(4,0,count_00);
        iVar7 = iVar7 + count_00;
      }
      glwEndQuery(this->m_queryMode);
      if (((int)((uVar10 & 0xffffffff) % 0x32) == 0) &&
         (pqVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_watchDog,
         pqVar3 != (qpWatchDog *)0x0)) {
        qpWatchDog_touch(pqVar3);
      }
    }
    glwFinish();
    glwDisable(0xb71);
    deGetMicroseconds();
    poVar1 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Total duration: ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<((ostream *)poVar1," ms");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    iVar7 = 0;
    uVar8 = 0;
    while( true ) {
      if (*value_00 <= (int)uVar8) {
        glwDeleteQueries(*value_00,
                         queryIds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start);
        err = glwGetError();
        glu::checkError(err,"Occlusion queries finished",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sOcclusionQueryTests.cpp"
                        ,0x114);
        poVar1 = (ostringstream *)(local_1b0 + 8);
        local_1b0._0_8_ = log;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,"Case passed!");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        iVar7 = this->m_iterNdx + 1;
        this->m_iterNdx = iVar7;
        tcu::ScopedLogSection::~ScopedLogSection(&section);
        std::__cxx11::string::~string((string *)&sectionName);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  (&queryResult.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  (&queryResultReady.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                  );
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  (&queryIds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                  (&targetVertices.super__Vector_base<float,_std::allocator<float>_>);
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                  (&occluderVertices.super__Vector_base<float,_std::allocator<float>_>);
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                  (&vertices.super__Vector_base<float,_std::allocator<float>_>);
        return (IterateResult)(iVar7 < 3);
      }
      glwGetQueryObjectuiv
                (queryIds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start[(int)uVar8],0x8867,
                 queryResultReady.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start + (int)uVar8);
      if (queryResultReady.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[(int)uVar8] != 1) break;
      glwGetQueryObjectuiv
                (queryIds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start[(int)uVar8],0x8866,
                 queryResult.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                 .super__Vector_impl_data._M_start + (int)uVar8);
      if (((uVar8 / 0x32) * 0x32 + iVar7 == 0) &&
         (pqVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_watchDog,
         pqVar3 != (qpWatchDog *)0x0)) {
        qpWatchDog_touch(pqVar3);
      }
      uVar8 = uVar8 + 1;
      iVar7 = iVar7 + -1;
    }
    pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar6,"Occlusion query failed to return a result after glFinish()",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sOcclusionQueryTests.cpp"
               ,0x10d);
    __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar6,(char *)0x0,"m_program",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sOcclusionQueryTests.cpp"
             ,0xce);
  __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

OcclusionQueryStressCase::IterateResult OcclusionQueryStressCase::iterate (void)
{
	tcu::TestLog&				log				 = m_testCtx.getLog();
	deUint32					colorUnif		 = glGetUniformLocation(m_program->getProgram(), "u_color");

	std::vector<float>			vertices;
	std::vector<float>			occluderVertices;
	std::vector<float>			targetVertices;
	std::vector<deUint32>		queryIds		 (m_numQueries, 0);
	std::vector<deUint32>		queryResultReady (m_numQueries, 0);
	std::vector<deUint32>		queryResult		 (m_numQueries, 0);

	std::string					sectionName		("Case iteration " + de::toString(m_iterNdx+1) + "/" + de::toString(NUM_CASE_ITERATIONS));
	tcu::ScopedLogSection		section			(log, sectionName.c_str(), sectionName.c_str());

	log << tcu::TestLog::Message << "Parameters:\n"
								 << "- Number of occlusion queries: "		 << m_numQueries		<< ".\n"
								 << "- Number of occluder draws per query: " << m_numOccluderDraws	<< ", primitives per draw: " << m_numOccludersPerDraw << ".\n"
								 << "- Number of target draws per query: "	 << m_numTargetDraws	<< ", primitives per draw: " << m_numTargetsPerDraw	  << ".\n"
		<< tcu::TestLog::EndMessage;

	int numOccluderIndicesPerDraw = 3*m_numOccludersPerDraw;
	int numTargetIndicesPerDraw = 3*m_numTargetsPerDraw;

	// Generate vertex data

	vertices.resize(4*NUM_GENERATED_VERTICES);

	for (int i = 0; i < NUM_GENERATED_VERTICES; i++)
	{
		vertices[4*i    ] = m_rnd.getFloat(-1.0f, 1.0f);
		vertices[4*i + 1] = m_rnd.getFloat(-1.0f, 1.0f);
		vertices[4*i + 2] = m_rnd.getFloat(0.0f, 1.0f);
		vertices[4*i + 3] = 1.0f;
	}

	// Generate primitives

	occluderVertices.resize(4*numOccluderIndicesPerDraw * m_numOccluderDraws);

	for (int i = 0; i < numOccluderIndicesPerDraw * m_numOccluderDraws; i++)
	{
		int vtxNdx = m_rnd.getInt(0, NUM_GENERATED_VERTICES-1);
		occluderVertices[4*i    ] = vertices[4*vtxNdx];
		occluderVertices[4*i + 1] = vertices[4*vtxNdx + 1];
		occluderVertices[4*i + 2] = vertices[4*vtxNdx + 2];
		occluderVertices[4*i + 3] = vertices[4*vtxNdx + 3];
	}

	targetVertices.resize(4*numTargetIndicesPerDraw * m_numTargetDraws);

	for (int i = 0; i < numTargetIndicesPerDraw * m_numTargetDraws; i++)
	{
		int vtxNdx = m_rnd.getInt(0, NUM_GENERATED_VERTICES-1);
		targetVertices[4*i    ] = vertices[4*vtxNdx];
		targetVertices[4*i + 1] = vertices[4*vtxNdx + 1];
		targetVertices[4*i + 2] = vertices[4*vtxNdx + 2];
		targetVertices[4*i + 3] = vertices[4*vtxNdx + 3];
	}

	TCU_CHECK(m_program);

	glClearColor				(0.0f, 0.0f, 0.0f, 1.0f);
	glClearDepthf				(1.0f);
	glClear						(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
	glEnable					(GL_DEPTH_TEST);
	glUseProgram				(m_program->getProgram());
	glEnableVertexAttribArray	(0);

	deUint64 time = deGetMicroseconds();

	for (int queryIter = 0; queryIter < m_numQueries; queryIter++)
	{
		// Draw occluders

		glUniform4f	(colorUnif, OCCLUDER_COLOR.x(), OCCLUDER_COLOR.y(), OCCLUDER_COLOR.z(), OCCLUDER_COLOR.w());

		for (int drawIter = 0; drawIter < m_numOccluderDraws; drawIter++)
		{
			glVertexAttribPointer	(0, 4, GL_FLOAT, GL_FALSE, 0, &occluderVertices[drawIter * numOccluderIndicesPerDraw]);
			glDrawArrays			(GL_TRIANGLES, 0, numOccluderIndicesPerDraw);
		}

		// Begin occlusion query

		glGenQueries	(1, &queryIds[queryIter]);
		glBeginQuery	(m_queryMode, queryIds[queryIter]);

		// Draw targets

		glUniform4f	(colorUnif, TARGET_COLOR.x(), TARGET_COLOR.y(), TARGET_COLOR.z(), TARGET_COLOR.w());

		for (int drawIter = 0; drawIter < m_numTargetDraws; drawIter++)
		{
			glVertexAttribPointer	(0, 4, GL_FLOAT, GL_FALSE, 0, &targetVertices[drawIter * numTargetIndicesPerDraw]);
			glDrawArrays			(GL_TRIANGLES, 0, numTargetIndicesPerDraw);
		}

		// End occlusion query

		glEndQuery		(m_queryMode);

		if ((queryIter % WATCHDOG_INTERVAL) == 0 && m_testCtx.getWatchDog())
			qpWatchDog_touch(m_testCtx.getWatchDog());
	}

	glFinish();
	glDisable(GL_DEPTH_TEST);

	deUint64 dTime = deGetMicroseconds() - time;
	log << tcu::TestLog::Message << "Total duration: " << dTime/1000 << " ms" << tcu::TestLog::EndMessage;

	// Get results

	for (int queryIter = 0; queryIter < m_numQueries; queryIter++)
	{
		glGetQueryObjectuiv(queryIds[queryIter], GL_QUERY_RESULT_AVAILABLE, &queryResultReady[queryIter]);

		if (queryResultReady[queryIter] == GL_TRUE)
		{
			glGetQueryObjectuiv(queryIds[queryIter], GL_QUERY_RESULT, &queryResult[queryIter]);
		}
		else
			TCU_FAIL("Occlusion query failed to return a result after glFinish()");

		if ((queryIter % WATCHDOG_INTERVAL) == 0 && m_testCtx.getWatchDog())
			qpWatchDog_touch(m_testCtx.getWatchDog());
	}

	glDeleteQueries	(m_numQueries, &queryIds[0]);
	GLU_CHECK_MSG	("Occlusion queries finished");

	log << tcu::TestLog::Message << "Case passed!" << tcu::TestLog::EndMessage;

	return (++m_iterNdx < NUM_CASE_ITERATIONS) ? CONTINUE : STOP;
}